

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

wostream * Centaurus::operator<<(wostream *os,CharClass<wchar_t> *cc)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  pointer pRVar4;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_30;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_28;
  const_iterator i;
  CharClass<wchar_t> *cc_local;
  wostream *os_local;
  
  i._M_current = (Range<wchar_t> *)cc;
  bVar1 = CharClass<wchar_t>::is_epsilon(cc);
  if (!bVar1) {
    local_28._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cbegin
                   ((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                     *)&(i._M_current)->m_start);
    std::operator<<(os,L'[');
    while( true ) {
      local_30._M_current =
           (Range<wchar_t> *)
           std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                     ((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                       *)&(i._M_current)->m_start);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      pRVar4 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator->(&local_28);
      wVar2 = Range<wchar_t>::end(pRVar4);
      pRVar4 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator->(&local_28);
      wVar3 = Range<wchar_t>::start(pRVar4);
      if (wVar2 == wVar3 + L'\x01') {
        pRVar4 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                 ::operator->(&local_28);
        wVar2 = Range<wchar_t>::start(pRVar4);
        printc(os,wVar2);
      }
      else {
        pRVar4 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                 ::operator->(&local_28);
        wVar2 = Range<wchar_t>::start(pRVar4);
        printc(os,wVar2);
        std::operator<<(os,L'-');
        pRVar4 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                 ::operator->(&local_28);
        wVar2 = Range<wchar_t>::end(pRVar4);
        printc(os,wVar2 + L'\xffffffff');
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
      ::operator++(&local_28,0);
    }
    std::operator<<(os,L']');
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const CharClass<TCHAR>& cc)
{
    if (cc.is_epsilon()) return os;

    auto i = cc.m_ranges.cbegin();

	os << L'[';
    for (; i != cc.m_ranges.cend();)
    {
        if (i->end() == i->start() + 1)
        {
            /*if (i->start() == wide_to_target<TCHAR>(L'"'))
                os << L"\\\"";
            else if (i->start() == wide_to_target<TCHAR>(L'\\'))
                os << L"\\\\";
            else
            {
                wchar_t ch = os.widen(i->start(), '@');
                os << (std::isprint(ch) ? ch : '@');
            }*/
			printc(os, i->start());
        }
        else
        {
			printc(os, i->start());
            os << L'-';
			printc(os, (TCHAR)(i->end() - 1));
        }
        i++;
    }
	os << L']';
    return os;
}